

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkaccessbackend_p.cpp
# Opt level: O0

int __thiscall
QNetworkAccessBackend::qt_metacall(QNetworkAccessBackend *this,Call _c,int _id,void **_a)

{
  void **in_RCX;
  uint in_EDX;
  int in_ESI;
  QObject *in_RDI;
  undefined4 local_4;
  
  local_4 = QObject::qt_metacall((Call)in_RDI,in_ESI,(void **)(ulong)in_EDX);
  if (-1 < local_4) {
    if (in_ESI == 0) {
      if (local_4 < 7) {
        qt_static_metacall(in_RDI,InvokeMetaMethod,local_4,in_RCX);
      }
      local_4 = local_4 + -7;
    }
    if (in_ESI == 7) {
      if (local_4 < 7) {
        qt_static_metacall(in_RDI,RegisterMethodArgumentMetaType,local_4,in_RCX);
      }
      local_4 = local_4 + -7;
    }
  }
  return local_4;
}

Assistant:

int QNetworkAccessBackend::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 7)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 7;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 7)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 7;
    }
    return _id;
}